

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void __thiscall
Js::JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto
          (JavascriptPromiseCapability *this,SnapPromiseCapabilityInfo *snapPromiseCapability,
          List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *depOnList,SlabAllocator *alloc)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  
  snapPromiseCapability->CapabilityId = (TTD_PTR_ID)this;
  snapPromiseCapability->PromiseVar = (this->promise).ptr;
  bVar3 = TTD::JsSupport::IsVarComplexKind((this->promise).ptr);
  if (bVar3) {
    pvVar2 = (this->resolve).ptr;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(depOnList,0);
    iVar1 = (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
            count;
    (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer
    [iVar1] = (unsigned_long)pvVar2;
    (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count =
         iVar1 + 1;
  }
  snapPromiseCapability->ResolveVar = (this->resolve).ptr;
  bVar3 = TTD::JsSupport::IsVarComplexKind((this->resolve).ptr);
  if (bVar3) {
    pvVar2 = (this->resolve).ptr;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(depOnList,0);
    iVar1 = (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
            count;
    (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer
    [iVar1] = (unsigned_long)pvVar2;
    (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count =
         iVar1 + 1;
  }
  snapPromiseCapability->RejectVar = (this->reject).ptr;
  bVar3 = TTD::JsSupport::IsVarComplexKind((this->reject).ptr);
  if (bVar3) {
    pvVar2 = (this->reject).ptr;
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(depOnList,0);
    iVar1 = (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
            count;
    (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer
    [iVar1] = (unsigned_long)pvVar2;
    (depOnList->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count =
         iVar1 + 1;
  }
  return;
}

Assistant:

void JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto(TTD::NSSnapValues::SnapPromiseCapabilityInfo* snapPromiseCapability, JsUtil::List<TTD_PTR_ID, HeapAllocator>& depOnList, TTD::SlabAllocator& alloc)
    {
        snapPromiseCapability->CapabilityId = TTD_CONVERT_PROMISE_INFO_TO_PTR_ID(this);

        snapPromiseCapability->PromiseVar = this->promise;
        if(TTD::JsSupport::IsVarComplexKind(this->promise))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->resolve));
        }

        snapPromiseCapability->ResolveVar = this->resolve;
        if(TTD::JsSupport::IsVarComplexKind(this->resolve))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->resolve));
        }

        snapPromiseCapability->RejectVar = this->reject;
        if(TTD::JsSupport::IsVarComplexKind(this->reject))
        {
            depOnList.Add(TTD_CONVERT_VAR_TO_PTR_ID(this->reject));
        }
    }